

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void remove_short_regions(REGIONS *regions,int *num_regions,REGION_TYPES type,int length)

{
  int iVar1;
  long lVar2;
  int k;
  int local_2c;
  
  local_2c = 0;
  iVar1 = *num_regions;
  if (1 < iVar1) {
    do {
      lVar2 = (long)local_2c;
      if (((regions[lVar2].last - regions[lVar2].start) + 1 < length) &&
         (regions[lVar2].type == type)) {
        remove_region(2,regions,num_regions,&local_2c);
        iVar1 = *num_regions;
      }
      else {
        local_2c = local_2c + 1;
      }
    } while ((local_2c < iVar1) && (1 < iVar1));
  }
  cleanup_regions(regions,num_regions);
  return;
}

Assistant:

static void remove_short_regions(REGIONS *regions, int *num_regions,
                                 REGION_TYPES type, int length) {
  int k = 0;
  while (k < *num_regions && (*num_regions) > 1) {
    if ((regions[k].last - regions[k].start + 1 < length &&
         regions[k].type == type)) {
      // merge current region with the previous and next regions
      remove_region(2, regions, num_regions, &k);
    } else {
      k++;
    }
  }
  cleanup_regions(regions, num_regions);
}